

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonlinear_Buffer.cpp
# Opt level: O0

void __thiscall Nonlinear_Buffer::enable_nonlinearity(Nonlinear_Buffer *this,Nes_Apu *apu,bool b)

{
  byte in_DL;
  Blip_Buffer *in_RSI;
  Nes_Apu *in_RDI;
  int i;
  Nes_Apu *in_stack_ffffffffffffffc8;
  Nes_Nonlinearizer *in_stack_ffffffffffffffd0;
  int local_18;
  
  if ((in_DL & 1) != 0) {
    (**(code **)&in_RDI->oscs[0][1].last_amp)();
  }
  Nes_Nonlinearizer::enable(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,false);
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    Nes_Apu::osc_output(in_RDI,local_18,in_RSI);
  }
  return;
}

Assistant:

void Nonlinear_Buffer::enable_nonlinearity( Nes_Apu& apu, bool b )
{
	if ( b )
		clear();
	nonlinearizer.enable( apu, b );
	for ( int i = 0; i < apu.osc_count; i++ )
		apu.osc_output( i, (i >= 2 ? &tnd : &buf) );
}